

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O0

void sse::Accumulate(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t *outY,
                    uint32_t simdWidth,uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  byte *pbVar6;
  undefined1 (*in_RCX) [16];
  undefined1 (*in_RDX) [16];
  undefined1 (*in_RSI) [16];
  uint in_EDI;
  uint in_R8D;
  uint in_R9D;
  simd data;
  simd *dst;
  simd *srcEnd;
  simd *src;
  uint32_t width;
  simd zero;
  int *local_2e0;
  byte *local_2d0;
  undefined1 (*local_258) [16];
  undefined1 (*local_248) [16];
  undefined1 (*local_220) [16];
  undefined1 (*local_210) [16];
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_178;
  undefined8 uStack_170;
  uint32_t *outX;
  uint8_t *imageXEnd;
  uint8_t *imageX;
  simd data_4;
  simd data_3;
  simd data_2;
  simd data_1;
  simd dataHi;
  simd dataLo;
  
  local_220 = in_RCX;
  for (local_210 = in_RSI; local_210 != in_RDX;
      local_210 = (undefined1 (*) [16])(*local_210 + in_EDI)) {
    local_258 = local_220;
    for (local_248 = local_210; local_248 != local_210 + in_R8D; local_248 = local_248 + 1) {
      auVar3 = vpunpcklbw_avx(*local_248,ZEXT816(0));
      auVar1 = vpunpckhbw_avx(*local_248,ZEXT816(0));
      auVar4 = vpunpcklwd_avx(auVar3,ZEXT816(0));
      auVar3 = vpunpckhwd_avx(auVar3,ZEXT816(0));
      auVar5 = vpunpcklwd_avx(auVar1,ZEXT816(0));
      auVar2 = vpunpckhwd_avx(auVar1,ZEXT816(0));
      auVar1 = vpaddd_avx(auVar4,*local_258);
      local_178 = auVar1._0_8_;
      uStack_170 = auVar1._8_8_;
      *(undefined8 *)*local_258 = local_178;
      *(undefined8 *)(*local_258 + 8) = uStack_170;
      auVar1 = vpaddd_avx(auVar3,local_258[1]);
      local_198 = auVar1._0_8_;
      uStack_190 = auVar1._8_8_;
      *(undefined8 *)local_258[1] = local_198;
      *(undefined8 *)(local_258[1] + 8) = uStack_190;
      auVar1 = vpaddd_avx(auVar5,local_258[2]);
      local_1b8 = auVar1._0_8_;
      uStack_1b0 = auVar1._8_8_;
      *(undefined8 *)local_258[2] = local_1b8;
      *(undefined8 *)(local_258[2] + 8) = uStack_1b0;
      auVar1 = vpaddd_avx(auVar2,local_258[3]);
      local_1d8 = auVar1._0_8_;
      uStack_1d0 = auVar1._8_8_;
      *(undefined8 *)local_258[3] = local_1d8;
      *(undefined8 *)(local_258[3] + 8) = uStack_1d0;
      local_258 = local_258 + 4;
    }
    if ((uint)data[1] != 0) {
      local_2d0 = *local_210 + in_R9D;
      pbVar6 = local_2d0 + (uint)data[1];
      local_2e0 = (int *)(*local_220 + (ulong)in_R9D * 4);
      for (; local_2d0 != pbVar6; local_2d0 = local_2d0 + 1) {
        *local_2e0 = (uint)*local_2d0 + *local_2e0;
        local_2e0 = local_2e0 + 1;
      }
    }
    local_220 = (undefined1 (*) [16])(*local_220 + (ulong)(in_R9D + (uint)data[1]) * 4);
  }
  return;
}

Assistant:

void Accumulate( uint32_t rowSize, const uint8_t * imageY, const uint8_t * imageYEnd, uint32_t * outY, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        simd zero = _mm_setzero_si128();

        const uint32_t width = totalSimdWidth + nonSimdWidth;

        for( ; imageY != imageYEnd; imageY += rowSize, outY += width ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;
            simd       * dst    = reinterpret_cast <simd*> (outY);

            for( ; src != srcEnd; ++src ) {
                simd data = _mm_loadu_si128( src );

                const simd dataLo  = _mm_unpacklo_epi8( data, zero );
                const simd dataHi  = _mm_unpackhi_epi8( data, zero );

                const simd data_1 = _mm_unpacklo_epi16( dataLo, zero );
                const simd data_2 = _mm_unpackhi_epi16( dataLo, zero );
                const simd data_3 = _mm_unpacklo_epi16( dataHi, zero );
                const simd data_4 = _mm_unpackhi_epi16( dataHi, zero );

                _mm_storeu_si128( dst, _mm_add_epi32( data_1, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_2, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_3, _mm_loadu_si128( dst ) ) );
                ++dst;
                _mm_storeu_si128( dst, _mm_add_epi32( data_4, _mm_loadu_si128( dst ) ) );
                ++dst;
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;
                uint32_t      * outX      = outY + totalSimdWidth;

                for( ; imageX != imageXEnd; ++imageX, ++outX )
                    (*outX) += (*imageX);
            }   
        }
    }